

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testMultiPartFileMixingBasic.cpp
# Opt level: O1

void anon_unknown.dwarf_1c2549::fillPixels<half>
               (Array2D<unsigned_int> *sampleCount,Array2D<half_*> *ph,int width,int height)

{
  short sVar1;
  unsigned_short uVar2;
  ulong uVar3;
  half **pphVar4;
  half *phVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  float fVar9;
  uif x;
  
  uVar3 = (long)height * (long)width;
  pphVar4 = (half **)operator_new__(-(ulong)(uVar3 >> 0x3d != 0) | uVar3 * 8);
  if (ph->_data != (half **)0x0) {
    operator_delete__(ph->_data);
  }
  ph->_sizeX = (long)height;
  ph->_sizeY = (long)width;
  ph->_data = pphVar4;
  if (0 < height) {
    uVar3 = 0;
    do {
      if (0 < width) {
        uVar7 = 0;
        do {
          phVar5 = (half *)operator_new__((ulong)sampleCount->_data
                                                 [sampleCount->_sizeY * uVar3 + uVar7] * 2);
          ph->_data[ph->_sizeY * uVar3 + uVar7] = phVar5;
          if (sampleCount->_data[sampleCount->_sizeY * uVar3 + uVar7] != 0) {
            uVar6 = (uint)((int)uVar7 + (int)uVar3 * width) % 0x801;
            fVar9 = (float)uVar6;
            uVar8 = 0;
            do {
              phVar5 = ph->_data[ph->_sizeY * uVar3 + uVar7];
              uVar2 = (unsigned_short)((uint)fVar9 >> 0x10);
              if (uVar6 != 0) {
                sVar1 = *(short *)((long)&half::_eLut + (ulong)((uint)fVar9 >> 0x17) * 2);
                if (sVar1 == 0) {
                  uVar2 = half::convert((int)fVar9);
                }
                else {
                  uVar2 = sVar1 + (short)(((uint)fVar9 & 0x7fffff) + 0xfff +
                                          (uint)(((uint)fVar9 >> 0xd & 1) != 0) >> 0xd);
                }
              }
              phVar5[uVar8]._h = uVar2;
              uVar8 = uVar8 + 1;
            } while (uVar8 < sampleCount->_data[sampleCount->_sizeY * uVar3 + uVar7]);
          }
          uVar7 = uVar7 + 1;
        } while (uVar7 != (uint)width);
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 != (uint)height);
  }
  return;
}

Assistant:

void fillPixels (Array2D<unsigned int>& sampleCount, Array2D<T*> &ph, int width, int height)
{
    ph.resizeErase(height, width);
    for (int y = 0; y < height; ++y)
        for (int x = 0; x < width; ++x)
        {
            ph[y][x] = new T[sampleCount[y][x]];
            for (unsigned int i = 0; i < sampleCount[y][x]; i++)
            {
                //
                // We do this because half cannot store number bigger than 2048 exactly.
                //
                ph[y][x][i] = (y * width + x) % 2049;
            }
        }
}